

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

uintm __thiscall PatternBlock::getMask(PatternBlock *this,int4 startbit,int4 size)

{
  pointer puVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar4 = startbit + this->offset * -8;
  uVar5 = iVar4 >> 5;
  bVar3 = (byte)iVar4 & 0x1f;
  uVar6 = size + iVar4 + -1 >> 5;
  uVar2 = 0;
  if (-1 < (int)uVar5) {
    puVar1 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)uVar5 <
        (ulong)((long)(this->maskvec).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
      uVar2 = puVar1[uVar5];
    }
  }
  uVar2 = uVar2 << bVar3;
  if (uVar5 != uVar6) {
    uVar5 = 0;
    if (-1 < (int)uVar6) {
      puVar1 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar6 <
          (ulong)((long)(this->maskvec).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
        uVar5 = puVar1[uVar6];
      }
    }
    uVar2 = uVar2 | uVar5 >> (-bVar3 & 0x1f);
  }
  return uVar2 >> (-(char)size & 0x1fU);
}

Assistant:

uintm PatternBlock::getMask(int4 startbit,int4 size) const

{
  startbit -= 8*offset;
  // Note the division and remainder here is unsigned.  Then it is recast to signed. 
  // If startbit is negative, then wordnum1 is either negative or very big,
  // if (unsigned size is same as sizeof int)
  // In either case, shift should come out between 0 and 8*sizeof(uintm)-1
  int4 wordnum1 = startbit/(8*sizeof(uintm));
  int4 shift = startbit % (8*sizeof(uintm));
  int4 wordnum2 = (startbit+size-1)/(8*sizeof(uintm));
  uintm res;

  if ((wordnum1<0)||(wordnum1>=maskvec.size()))
    res = 0;
  else
    res = maskvec[wordnum1];

  res <<= shift;
  if (wordnum1 != wordnum2) {
    uintm tmp;
    if ((wordnum2<0)||(wordnum2>=maskvec.size()))
      tmp = 0;
    else
      tmp = maskvec[wordnum2];
    res |= (tmp>>(8*sizeof(uintm)-shift));
  }
  res >>= (8*sizeof(uintm) - size);
  
  return res;
}